

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall
logonAtLogonStartTimeFixture::logonAtLogonStartTimeFixture(logonAtLogonStartTimeFixture *this)

{
  int *piVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 uVar4;
  Session *pSVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  TimeRange logonTime;
  UtcTimeOnly local_98;
  UtcTimeOnly local_80;
  TimeRange local_68 [8];
  int local_60;
  undefined4 uStack_5c;
  int64_t iStack_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  Session local_30;
  
  anon_unknown.dwarf_5319c9::sessionFixture::sessionFixture((sessionFixture *)this,0);
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__sessionFixture_0032e298;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application = (_func_int **)&PTR__logonAtLogonStartTimeFixture_0032e2f0;
  FIX::DateTime::nowUtc();
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.m_date =
       local_60;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.m_time =
       iStack_58;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_date = 0;
  uVar4 = *(undefined8 *)
           &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime
            .field_0xc;
  *(undefined8 *)
   &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    field_0xc = uVar4;
  uVar2 = *(undefined4 *)
           ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.
                   super_DateTime.m_time + 4);
  *(undefined4 *)
   ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.
           super_DateTime.m_time + 4) = uVar2;
  auVar6 = SEXT816((this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.
                   super_DateTime.m_time) * SEXT816(0x112e0be826d694b3);
  lVar9 = (long)((int)(auVar6._8_8_ >> 0x1a) - (auVar6._12_4_ >> 0x1f));
  lVar10 = (lVar9 / 0xe10) * -0xe10 + (lVar9 / 0xe10) * 0xe10 + lVar9;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    field_0xc = uVar4;
  *(undefined4 *)
   ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
           super_DateTime.m_time + 4) = uVar2;
  auVar6 = SEXT816((this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
                   super_DateTime.m_time) * SEXT816(0x112e0be826d694b3);
  lVar9 = (long)((int)(auVar6._8_8_ >> 0x1a) - (auVar6._12_4_ >> 0x1f));
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_time = ((lVar9 / 0xe10) * -0xe10 + (lVar9 / 0xe10) * 0xe10 + lVar9) * 1000000000;
  uVar8 = lVar10 * 1000000000 - 10000000000;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_time = uVar8;
  if (lVar10 < 0x1518a) {
    if (lVar10 < 10) {
      (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime
      .m_date = -1;
      uVar8 = lVar10 * 1000000000 + 0x4e923d431c00;
      goto LAB_00285601;
    }
  }
  else {
    (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    m_date = 1;
    uVar8 = uVar8 % 86400000000000;
LAB_00285601:
    (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    m_time = uVar8;
  }
  piVar1 = &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime
            .m_date;
  iVar3 = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
          super_DateTime.m_date;
  lVar9 = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
          super_DateTime.m_time;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_time = lVar9 + 10000000000U;
  if (lVar9 < 0x4e923d431c00) {
    if (-0x2540be401 < lVar9) goto LAB_00285665;
    (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    m_date = iVar3 + -1;
    uVar8 = lVar9 + 0x4e96e55ae400;
  }
  else {
    (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    m_date = iVar3 + 1;
    uVar8 = (lVar9 + 10000000000U) % 86400000000000;
  }
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_time = uVar8;
LAB_00285665:
  uVar8 = *(ulong *)piVar1;
  lVar9 = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.
          m_time;
  local_80.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_00329128;
  uVar7 = *(ulong *)piVar1;
  lVar10 = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.
           m_time;
  local_98.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_00329128;
  local_80.super_DateTime._8_8_ = uVar8 & 0xffffffff00000000;
  uVar4 = local_80.super_DateTime._8_8_;
  local_80.super_DateTime.m_time = lVar9 + 1000000000;
  local_80.super_DateTime._12_4_ = SUB84(uVar8 >> 0x20,0);
  if (lVar9 < 0x4e9455b43600) {
    if (lVar9 < -1000000000) {
      local_80.super_DateTime.m_date = 0xffffffff;
      local_80.super_DateTime.m_time = lVar9 + 0x4e94cce9ca00;
      uVar4 = local_80.super_DateTime._8_8_;
    }
  }
  else {
    local_80.super_DateTime.m_date = 1;
    local_80.super_DateTime.m_time = (ulong)local_80.super_DateTime.m_time % 86400000000000;
    uVar4 = local_80.super_DateTime._8_8_;
  }
  local_80.super_DateTime._8_8_ = uVar4;
  local_98.super_DateTime._8_8_ = uVar7 & 0xffffffff00000000;
  uVar4 = local_98.super_DateTime._8_8_;
  local_98.super_DateTime.m_time = lVar10 + 2000000000;
  local_98.super_DateTime._12_4_ = SUB84(uVar7 >> 0x20,0);
  if (lVar10 < 0x4e941a196c00) {
    if (lVar10 < -2000000000) {
      local_98.super_DateTime.m_date = 0xffffffff;
      local_98.super_DateTime.m_time = lVar10 + 0x4e9508849400;
      uVar4 = local_98.super_DateTime._8_8_;
    }
  }
  else {
    local_98.super_DateTime.m_date = 1;
    local_98.super_DateTime.m_time = (ulong)local_98.super_DateTime.m_time % 86400000000000;
    uVar4 = local_98.super_DateTime._8_8_;
  }
  local_98.super_DateTime._8_8_ = uVar4;
  FIX::TimeRange::TimeRange(local_68,&local_80,&local_98,-1,-1);
  pSVar5 = (this->super_acceptorFixture).super_sessionFixture.object;
  *(ulong *)(pSVar5 + 0x1c8) = CONCAT44(uStack_5c,local_60);
  *(int64_t *)(pSVar5 + 0x1d0) = iStack_58;
  *(undefined8 *)(pSVar5 + 0x1e0) = local_48;
  *(undefined8 *)(pSVar5 + 0x1e8) = uStack_40;
  pSVar5[0x1f8] = local_30;
  *(undefined8 *)(pSVar5 + 0x1f0) = local_38;
  return;
}

Assistant:

logonAtLogonStartTimeFixture() {
    now.setCurrent();
    startTime = now;
    startTime.setMillisecond(0);

    endTime = now;
    endTime.setMillisecond(0);

    startTime += -10;
    endTime += 10;

    UtcTimeOnly logonStartTime(now);
    UtcTimeOnly logonEndTime(now);
    logonStartTime += 1;
    logonEndTime += 2;
    TimeRange logonTime(logonStartTime, logonEndTime);

    object->setLogonTime(logonTime);
  }